

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

_Bool CheckCollisionLines(Vector2 startPos1,Vector2 endPos1,Vector2 startPos2,Vector2 endPos2,
                         Vector2 *collisionPoint)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 in_XMM0_Qb;
  float fVar4;
  float fVar5;
  undefined8 in_XMM1_Qb;
  float fVar6;
  float fVar7;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar8;
  float fVar9;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  
  fVar8 = endPos2.x;
  fVar9 = endPos2.y;
  fVar6 = startPos2.x;
  fVar7 = startPos2.y;
  fVar4 = endPos1.x;
  fVar5 = endPos1.y;
  fVar2 = startPos1.x;
  fVar3 = startPos1.y;
  fVar13 = (fVar4 - fVar2) * (fVar9 - fVar7) - (fVar5 - fVar3) * (fVar8 - fVar6);
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    fVar10 = fVar2 * fVar5 - fVar4 * fVar3;
    fVar14 = fVar6 * fVar9 - fVar8 * fVar7;
    auVar11._0_4_ = fVar10 * (fVar6 - fVar8) - fVar14 * (fVar2 - fVar4);
    auVar11._4_4_ = fVar10 * (fVar7 - fVar9) - fVar14 * (fVar3 - fVar5);
    auVar11._8_4_ =
         fVar10 * (in_XMM2_Dc - in_XMM3_Dc) - fVar14 * ((float)in_XMM0_Qb - (float)in_XMM1_Qb);
    auVar11._12_4_ =
         fVar10 * (in_XMM2_Dd - in_XMM3_Dd) -
         fVar14 * ((float)((ulong)in_XMM0_Qb >> 0x20) - (float)((ulong)in_XMM1_Qb >> 0x20));
    auVar12._4_4_ = fVar13;
    auVar12._0_4_ = fVar13;
    auVar12._8_4_ = fVar13;
    auVar12._12_4_ = fVar13;
    auVar12 = divps(auVar11,auVar12);
    fVar13 = fVar4;
    if (fVar2 <= fVar4) {
      fVar13 = fVar2;
    }
    fVar10 = auVar12._0_4_;
    _Var1 = false;
    if (fVar13 <= fVar10) {
      fVar13 = fVar4;
      if (fVar4 <= fVar2) {
        fVar13 = fVar2;
      }
      if (fVar10 <= (float)(~-(uint)NAN(fVar2) & (uint)fVar13 | (uint)fVar4 & -(uint)NAN(fVar2))) {
        fVar2 = fVar8;
        if (fVar6 <= fVar8) {
          fVar2 = fVar6;
        }
        fVar4 = fVar8;
        if (fVar8 <= fVar6) {
          fVar4 = fVar6;
        }
        _Var1 = false;
        if (((float)(~-(uint)NAN(fVar6) & (uint)fVar2 | -(uint)NAN(fVar6) & (uint)fVar8) <= fVar10)
           && (_Var1 = false, fVar10 <= fVar4)) {
          fVar2 = fVar5;
          if (fVar3 <= fVar5) {
            fVar2 = fVar3;
          }
          fVar6 = auVar12._4_4_;
          fVar4 = fVar5;
          if (fVar5 <= fVar3) {
            fVar4 = fVar3;
          }
          _Var1 = false;
          if (((float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar5) <= fVar6)
             && (_Var1 = false, fVar6 <= fVar4)) {
            fVar2 = fVar9;
            if (fVar7 <= fVar9) {
              fVar2 = fVar7;
            }
            fVar3 = fVar9;
            if (fVar9 <= fVar7) {
              fVar3 = fVar7;
            }
            _Var1 = false;
            if ((((float)(~-(uint)NAN(fVar7) & (uint)fVar2 | -(uint)NAN(fVar7) & (uint)fVar9) <=
                  fVar6) && (_Var1 = false, fVar6 <= fVar3)) &&
               (_Var1 = true, collisionPoint != (Vector2 *)0x0)) {
              *collisionPoint = auVar12._0_8_;
              return _Var1;
            }
          }
        }
      }
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool CheckCollisionLines(Vector2 startPos1, Vector2 endPos1, Vector2 startPos2, Vector2 endPos2, Vector2 *collisionPoint)
{
    const float div = (endPos2.y - startPos2.y)*(endPos1.x - startPos1.x) - (endPos2.x - startPos2.x)*(endPos1.y - startPos1.y);

    if (div == 0.0f) return false;      // WARNING: This check could not work due to float precision rounding issues...

    const float xi = ((startPos2.x - endPos2.x)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.x - endPos1.x)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;
    const float yi = ((startPos2.y - endPos2.y)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.y - endPos1.y)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;

    if (xi < fminf(startPos1.x, endPos1.x) || xi > fmaxf(startPos1.x, endPos1.x)) return false;
    if (xi < fminf(startPos2.x, endPos2.x) || xi > fmaxf(startPos2.x, endPos2.x)) return false;
    if (yi < fminf(startPos1.y, endPos1.y) || yi > fmaxf(startPos1.y, endPos1.y)) return false;
    if (yi < fminf(startPos2.y, endPos2.y) || yi > fmaxf(startPos2.y, endPos2.y)) return false;

    if (collisionPoint != 0)
    {
        collisionPoint->x = xi;
        collisionPoint->y = yi;
    }

    return true;
}